

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_MergeExtractInsert_Test::
~ParallelFlatHashSet_MergeExtractInsert_Test(ParallelFlatHashSet_MergeExtractInsert_Test *this)

{
  ParallelFlatHashSet_MergeExtractInsert_Test *this_local;
  
  ~ParallelFlatHashSet_MergeExtractInsert_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, MergeExtractInsert) {
  struct Hash {
    size_t operator()(const std::unique_ptr<int>& p) const { return *p; }
  };
  struct Eq {
    bool operator()(const std::unique_ptr<int>& a,
                    const std::unique_ptr<int>& b) const {
      return *a == *b;
    }
  };
  phmap::THIS_HASH_SET<std::unique_ptr<int>, Hash, Eq> set1, set2;
  set1.insert(phmap::make_unique<int>(7));
  set1.insert(phmap::make_unique<int>(17));

  set2.insert(phmap::make_unique<int>(7));
  set2.insert(phmap::make_unique<int>(19));

  EXPECT_THAT(set1, UnorderedElementsAre(Pointee(7), Pointee(17)));
  EXPECT_THAT(set2, UnorderedElementsAre(Pointee(7), Pointee(19)));

  set1.merge(set2);

  EXPECT_THAT(set1, UnorderedElementsAre(Pointee(7), Pointee(17), Pointee(19)));
  EXPECT_THAT(set2, UnorderedElementsAre(Pointee(7)));

  auto node = set1.extract(phmap::make_unique<int>(7));
  EXPECT_TRUE(node);
  EXPECT_THAT(node.value(), Pointee(7));
  EXPECT_THAT(set1, UnorderedElementsAre(Pointee(17), Pointee(19)));

  auto insert_result = set2.insert(std::move(node));
  EXPECT_FALSE(node);
  EXPECT_FALSE(insert_result.inserted);
  EXPECT_TRUE(insert_result.node);
  EXPECT_THAT(insert_result.node.value(), Pointee(7));
  EXPECT_EQ(**insert_result.position, 7);
  EXPECT_NE(insert_result.position->get(), insert_result.node.value().get());
  EXPECT_THAT(set2, UnorderedElementsAre(Pointee(7)));

  node = set1.extract(phmap::make_unique<int>(17));
  EXPECT_TRUE(node);
  EXPECT_THAT(node.value(), Pointee(17));
  EXPECT_THAT(set1, UnorderedElementsAre(Pointee(19)));

  node.value() = phmap::make_unique<int>(23);

  insert_result = set2.insert(std::move(node));
  EXPECT_FALSE(node);
  EXPECT_TRUE(insert_result.inserted);
  EXPECT_FALSE(insert_result.node);
  EXPECT_EQ(**insert_result.position, 23);
  EXPECT_THAT(set2, UnorderedElementsAre(Pointee(7), Pointee(23)));
}